

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyBuildItem(Scl_Tree_t *p,char **ppPos,char *pEnd)

{
  char cVar1;
  char *pcVar2;
  char *pPos;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  Scl_Item_t *pSVar8;
  long lVar9;
  Scl_Pair_t SVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  
  do {
    iVar3 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar3 != 0) {
      return -2;
    }
    pcVar5 = *ppPos;
    pcVar6 = p->pContents;
    iVar3 = Scl_LibertySkipEntry(ppPos,pEnd);
    if (iVar3 != 0) {
      uVar13 = (long)pcVar5 - (long)pcVar6;
      lVar14 = 0;
LAB_00364d01:
      if (p->pError != (char *)0x0) {
        return -1;
      }
      pcVar6 = (char *)malloc(1000);
      p->pError = pcVar6;
      pcVar5 = p->pFileName;
      uVar11 = p->nLines;
      pcVar7 = Scl_LibertyReadString(p,(Scl_Pair_t)(uVar13 & 0xffffffff | lVar14 << 0x20));
      sprintf(pcVar6,"File \"%s\". Line %6d. Failed to parse entry \"%s\".\n",pcVar5,(ulong)uVar11,
              pcVar7);
      return -1;
    }
    pcVar7 = *ppPos;
    pcVar2 = p->pContents;
    iVar3 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar3 != 0) {
      uVar13 = (long)pcVar5 - (long)pcVar6;
      lVar14 = (long)pcVar7 - (long)pcVar2;
      goto LAB_00364d01;
    }
    pPos = *ppPos;
    cVar1 = *pPos;
    if (cVar1 != ';') {
      uVar13 = (long)pcVar5 - (long)pcVar6;
      iVar3 = (int)uVar13;
      if (cVar1 == '(') {
        lVar14 = (long)pcVar7 - (long)pcVar2;
        pcVar5 = Scl_LibertyFindMatch(pPos,pEnd);
        uVar11 = ((int)pPos - (int)p->pContents) + 1;
        lVar9 = (long)pcVar5 - (long)p->pContents;
        *ppPos = pcVar5 + 1;
        iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
        iVar12 = (int)lVar14;
        if (iVar4 != 0) {
          pSVar8 = Scl_LibertyNewItem(p,3);
          (pSVar8->Key).Beg = iVar3;
          (pSVar8->Key).End = iVar12;
          SVar10 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)((ulong)uVar11 | lVar9 << 0x20));
          pSVar8->Head = SVar10;
          lVar14 = (long)pSVar8 - (long)p->pItems;
          goto LAB_00364dc1;
        }
        pcVar5 = *ppPos;
        if (*pcVar5 == ';') {
          *ppPos = pcVar5 + 1;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = Scl_LibertyFindMatch(pcVar5,pEnd);
          iVar4 = *(int *)&p->pContents;
          pSVar8 = Scl_LibertyNewItem(p,1);
          (pSVar8->Key).Beg = iVar3;
          (pSVar8->Key).End = iVar12;
          SVar10 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)((ulong)uVar11 | lVar9 << 0x20));
          pSVar8->Head = SVar10;
          (pSVar8->Body).Beg = ((int)pcVar5 - iVar4) + 1;
          (pSVar8->Body).End = (int)pcVar6 - iVar4;
          *ppPos = pcVar5 + 1;
          iVar3 = Scl_LibertyBuildItem(p,ppPos,pcVar6);
          pSVar8->Child = iVar3;
          if (iVar3 != -1) {
            *ppPos = pcVar6 + 1;
            iVar3 = Scl_LibertyBuildItem(p,ppPos,pEnd);
            pSVar8->Next = iVar3;
            if (iVar3 != -1) {
              lVar14 = (long)pSVar8 - (long)p->pItems;
              goto LAB_00364dc1;
            }
          }
          goto LAB_00364d01;
        }
        pSVar8 = Scl_LibertyNewItem(p,3);
        (pSVar8->Key).Beg = iVar3;
        (pSVar8->Key).End = iVar12;
        SVar10 = (Scl_Pair_t)((ulong)uVar11 | lVar9 << 0x20);
      }
      else {
        lVar14 = (long)pcVar7 - (long)pcVar2;
        if (cVar1 != ':') goto LAB_00364d01;
        *ppPos = pPos + 1;
        iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
        if (iVar4 != 0) goto LAB_00364d01;
        pcVar5 = *ppPos;
        pcVar6 = p->pContents;
        iVar4 = Scl_LibertySkipEntry(ppPos,pEnd);
        if (iVar4 != 0) goto LAB_00364d01;
        pcVar7 = *ppPos;
        pcVar2 = p->pContents;
        iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,1);
        if (iVar4 != 0) goto LAB_00364d01;
        cVar1 = **ppPos;
        if ((cVar1 != ';') && (cVar1 != '\n')) goto LAB_00364d01;
        *ppPos = *ppPos + 1;
        pSVar8 = Scl_LibertyNewItem(p,2);
        (pSVar8->Key).Beg = iVar3;
        (pSVar8->Key).End = (int)lVar14;
        SVar10 = (Scl_Pair_t)
                 ((long)pcVar5 - (long)pcVar6 & 0xffffffffU | (long)pcVar7 - (long)pcVar2 << 0x20);
      }
      SVar10 = Scl_LibertyUpdateHead(p,SVar10);
      pSVar8->Head = SVar10;
      iVar3 = Scl_LibertyBuildItem(p,ppPos,pEnd);
      pSVar8->Next = iVar3;
      if (iVar3 != -1) {
        lVar14 = (long)pSVar8 - (long)p->pItems;
LAB_00364dc1:
        return (int)(lVar14 / 0x28);
      }
      goto LAB_00364d01;
    }
    *ppPos = pPos + 1;
  } while( true );
}

Assistant:

int Scl_LibertyBuildItem( Scl_Tree_t * p, char ** ppPos, char * pEnd )
{
    Scl_Item_t * pItem;
    Scl_Pair_t Key, Head, Body;
    char * pNext, * pStop;
    Key.End = 0;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        return -2;
    Key.Beg = *ppPos - p->pContents;
    if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
        goto exit;
    Key.End = *ppPos - p->pContents;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        goto exit;
    pNext = *ppPos;
    if ( *pNext == ':' )
    {
        *ppPos = pNext + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
            goto exit;
        Head.Beg = *ppPos - p->pContents;
        if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
            goto exit;
        Head.End = *ppPos - p->pContents;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 1 ) )
            goto exit;
        pNext = *ppPos;
        if ( *pNext != ';' && *pNext != '\n' )
            goto exit;
        *ppPos = pNext + 1;
        // end of equation
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_EQUA );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == '(' )
    {
        pStop = Scl_LibertyFindMatch( pNext, pEnd );
        Head.Beg = pNext - p->pContents + 1;
        Head.End = pStop - p->pContents;
        *ppPos = pStop + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        {
            // end of list
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            return Scl_LibertyItemId( p, pItem );
        }
        pNext = *ppPos;
        if ( *pNext == '{' ) // beginning of body
        {
            pStop = Scl_LibertyFindMatch( pNext, pEnd );
            Body.Beg = pNext - p->pContents + 1;
            Body.End = pStop - p->pContents;
            // end of body
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_PROC );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            pItem->Body = Body;
            *ppPos = pNext + 1;
            pItem->Child = Scl_LibertyBuildItem( p, ppPos, pStop );
            if ( pItem->Child == -1 )
                goto exit;
            *ppPos = pStop + 1;
            pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
            if ( pItem->Next == -1 )
                goto exit;
            return Scl_LibertyItemId( p, pItem );
        }
        // end of list
        if ( *pNext == ';' )
            *ppPos = pNext + 1;
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == ';' )
    {
        *ppPos = pNext + 1;
        return Scl_LibertyBuildItem(p, ppPos, pEnd);
    }
exit:
    if ( p->pError == NULL )
    {
        p->pError = ABC_ALLOC( char, 1000 );
        sprintf( p->pError, "File \"%s\". Line %6d. Failed to parse entry \"%s\".\n", 
            p->pFileName, p->nLines, Scl_LibertyReadString(p, Key) );
    }
    return -1;
}